

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O3

void wallet::InterpretFeeEstimationInstructions
               (UniValue *conf_target,UniValue *estimate_mode,UniValue *fee_rate,UniValue *options)

{
  pointer pcVar1;
  string key;
  string key_00;
  string key_01;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  bool bVar2;
  bool bVar3;
  int iVar4;
  UniValue *pUVar5;
  string *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  long in_FS_OFFSET;
  size_t i_1;
  size_t i;
  undefined8 in_stack_fffffffffffffdf8;
  _Alloc_hider in_stack_fffffffffffffe00;
  _Alloc_hider _Var7;
  size_type in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  VType VVar8;
  undefined4 in_stack_fffffffffffffe24;
  undefined8 in_stack_fffffffffffffe28;
  undefined1 *puVar9;
  undefined8 in_stack_fffffffffffffe30;
  long in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe40 [48];
  long *local_188 [2];
  long local_178 [2];
  VType local_168;
  long *local_160 [2];
  long local_150 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  vector<UniValue,_std::allocator<UniValue>_> local_128;
  long *local_110 [2];
  long local_100 [2];
  VType local_f0;
  long *local_e8 [2];
  long local_d8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  vector<UniValue,_std::allocator<UniValue>_> local_b0;
  long *local_98 [2];
  long local_88 [2];
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"conf_target","");
  bVar2 = ::UniValue::findKey(options,&local_58,(size_t *)&local_78);
  bVar3 = true;
  if (!bVar2) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"estimate_mode","");
    bVar3 = ::UniValue::findKey(options,&local_78,(size_t *)&stack0xfffffffffffffe00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (bVar3 == false) {
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"conf_target","");
    local_f0 = conf_target->typ;
    local_e8[0] = local_d8;
    pcVar1 = (conf_target->val)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_e8,pcVar1,pcVar1 + (conf_target->val)._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_c8,&conf_target->keys);
    std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_b0,&conf_target->values);
    key._M_string_length = (size_type)in_stack_fffffffffffffe00._M_p;
    key._M_dataplus._M_p = (pointer)in_stack_fffffffffffffdf8;
    key.field_2._M_allocated_capacity = in_stack_fffffffffffffe08;
    key.field_2._8_8_ = in_stack_fffffffffffffe10;
    val.val._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffe20;
    val._0_8_ = in_stack_fffffffffffffe18;
    val.val._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffe24;
    val.val._M_string_length = in_stack_fffffffffffffe28;
    val.val.field_2._M_allocated_capacity = in_stack_fffffffffffffe30;
    val.val.field_2._8_8_ = in_stack_fffffffffffffe38;
    val.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_fffffffffffffe40._0_24_;
    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data =
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffe40._24_24_;
    ::UniValue::pushKV(options,key,val);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8);
    if (local_e8[0] != local_d8) {
      operator_delete(local_e8[0],local_d8[0] + 1);
    }
    if (local_98[0] != local_88) {
      operator_delete(local_98[0],local_88[0] + 1);
    }
    local_110[0] = local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"estimate_mode","");
    local_168 = estimate_mode->typ;
    pcVar1 = (estimate_mode->val)._M_dataplus._M_p;
    local_160[0] = local_150;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_160,pcVar1,pcVar1 + (estimate_mode->val)._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_140,&estimate_mode->keys);
    std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_128,&estimate_mode->values);
    key_00._M_string_length = (size_type)in_stack_fffffffffffffe00._M_p;
    key_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffdf8;
    key_00.field_2._M_allocated_capacity = in_stack_fffffffffffffe08;
    key_00.field_2._8_8_ = in_stack_fffffffffffffe10;
    val_00.val._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffe20;
    val_00._0_8_ = in_stack_fffffffffffffe18;
    val_00.val._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffe24;
    val_00.val._M_string_length = in_stack_fffffffffffffe28;
    val_00.val.field_2._M_allocated_capacity = in_stack_fffffffffffffe30;
    val_00.val.field_2._8_8_ = in_stack_fffffffffffffe38;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_fffffffffffffe40._0_24_;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data =
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffe40._24_24_;
    ::UniValue::pushKV(options,key_00,val_00);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_128);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_140);
    if (local_160[0] != local_150) {
      operator_delete(local_160[0],local_150[0] + 1);
    }
    if (local_110[0] != local_100) {
      operator_delete(local_110[0],local_100[0] + 1);
    }
  }
  else if (estimate_mode->typ != VNULL || conf_target->typ != VNULL) {
    pUVar5 = (UniValue *)__cxa_allocate_exception(0x58);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,
               "Pass conf_target and estimate_mode either as arguments or in the options object, but not both"
               ,"");
    JSONRPCError(pUVar5,-8,&local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(pUVar5,&::UniValue::typeinfo,::UniValue::~UniValue);
    }
    goto LAB_00cc5a8a;
  }
  paVar6 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"fee_rate","");
  bVar2 = ::UniValue::findKey(options,&local_58,(size_t *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar6) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    if (fee_rate->typ != VNULL) {
      pUVar5 = (UniValue *)__cxa_allocate_exception(0x58);
      local_58._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,
                 "Pass the fee_rate either as an argument, or in the options object, but not both",
                 "");
      JSONRPCError(pUVar5,-8,&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar5,&::UniValue::typeinfo,::UniValue::~UniValue);
      }
      goto LAB_00cc5a8a;
    }
  }
  else {
    local_188[0] = local_178;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"fee_rate","");
    VVar8 = fee_rate->typ;
    pcVar1 = (fee_rate->val)._M_dataplus._M_p;
    puVar9 = &stack0xfffffffffffffe38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&stack0xfffffffffffffe28,pcVar1,pcVar1 + (fee_rate->val)._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stack0xfffffffffffffe48,&fee_rate->keys);
    std::vector<UniValue,_std::allocator<UniValue>_>::vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffffe60,
               &fee_rate->values);
    key_01._M_string_length = (size_type)in_stack_fffffffffffffe00._M_p;
    key_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffdf8;
    key_01.field_2._M_allocated_capacity = in_stack_fffffffffffffe08;
    key_01.field_2._8_8_ = in_stack_fffffffffffffe10;
    val_01.val._M_dataplus._M_p._0_4_ = VVar8;
    val_01._0_8_ = in_stack_fffffffffffffe18;
    val_01.val._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffe24;
    val_01.val._M_string_length = (size_type)puVar9;
    val_01.val.field_2._M_allocated_capacity = in_stack_fffffffffffffe30;
    val_01.val.field_2._8_8_ = in_stack_fffffffffffffe38;
    val_01.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_fffffffffffffe40._0_24_;
    val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data =
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffe40._24_24_;
    ::UniValue::pushKV(options,key_01,val_01);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffffe60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xfffffffffffffe48);
    if (puVar9 != &stack0xfffffffffffffe38) {
      operator_delete(puVar9,in_stack_fffffffffffffe38 + 1);
    }
    if (local_188[0] != local_178) {
      operator_delete(local_188[0],local_178[0] + 1);
    }
  }
  paVar6 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"conf_target","");
  pUVar5 = ::UniValue::operator[](options,&local_58);
  if (pUVar5->typ == VNULL) {
    bVar2 = false;
  }
  else {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"estimate_mode","");
    pUVar5 = ::UniValue::operator[](options,&local_78);
    if (pUVar5->typ == VNULL) {
      bVar2 = true;
    }
    else {
      _Var7._M_p = &stack0xfffffffffffffe10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffe00,"estimate_mode","");
      pUVar5 = ::UniValue::operator[](options,(string *)&stack0xfffffffffffffe00);
      this = ::UniValue::get_str_abi_cxx11_(pUVar5);
      iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(this,"unset");
      bVar2 = iVar4 == 0;
      if (_Var7._M_p != &stack0xfffffffffffffe10) {
        operator_delete(_Var7._M_p,in_stack_fffffffffffffe10 + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar6) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    pUVar5 = (UniValue *)__cxa_allocate_exception(0x58);
    local_58._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Specify estimate_mode","");
    JSONRPCError(pUVar5,-8,&local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(pUVar5,&::UniValue::typeinfo,::UniValue::~UniValue);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00cc5a8a:
  __stack_chk_fail();
}

Assistant:

static void InterpretFeeEstimationInstructions(const UniValue& conf_target, const UniValue& estimate_mode, const UniValue& fee_rate, UniValue& options)
{
    if (options.exists("conf_target") || options.exists("estimate_mode")) {
        if (!conf_target.isNull() || !estimate_mode.isNull()) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Pass conf_target and estimate_mode either as arguments or in the options object, but not both");
        }
    } else {
        options.pushKV("conf_target", conf_target);
        options.pushKV("estimate_mode", estimate_mode);
    }
    if (options.exists("fee_rate")) {
        if (!fee_rate.isNull()) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Pass the fee_rate either as an argument, or in the options object, but not both");
        }
    } else {
        options.pushKV("fee_rate", fee_rate);
    }
    if (!options["conf_target"].isNull() && (options["estimate_mode"].isNull() || (options["estimate_mode"].get_str() == "unset"))) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Specify estimate_mode");
    }
}